

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3ReadNextPos(char **pp,sqlite3_int64 *pi)

{
  byte bVar1;
  byte *p;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  uint local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  p = (byte *)*pp;
  bVar1 = *p;
  if (bVar1 < 2) {
    lVar3 = 0x7fffffffffffffff;
  }
  else {
    local_2c = 0xaaaaaaaa;
    if ((char)bVar1 < '\0') {
      uVar2 = sqlite3Fts3GetVarint32((char *)p,(int *)&local_2c);
      uVar4 = (ulong)uVar2;
      uVar2 = local_2c;
    }
    else {
      uVar4 = 1;
      uVar2 = (uint)bVar1;
    }
    *pp = (char *)(p + uVar4);
    lVar3 = (long)(int)uVar2 + *pi + -2;
  }
  *pi = lVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fts3ReadNextPos(
  char **pp,                    /* IN/OUT: Pointer into position-list buffer */
  sqlite3_int64 *pi             /* IN/OUT: Value read from position-list */
){
  if( (**pp)&0xFE ){
    int iVal;
    *pp += fts3GetVarint32((*pp), &iVal);
    *pi += iVal;
    *pi -= 2;
  }else{
    *pi = POSITION_LIST_END;
  }
}